

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::PointSizeCase::init(PointSizeCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int extraout_EAX;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  ProgramSources *pPVar4;
  ShaderProgram *this_00;
  RenderContext *renderCtx;
  TestError *this_01;
  allocator<char> local_e79;
  string local_e78;
  string local_e58;
  ShaderSource local_e38;
  string local_e10;
  ShaderSource local_df0;
  string local_dc8;
  ShaderSource local_da8;
  string local_d80;
  ShaderSource local_d60;
  string local_d38;
  ShaderSource local_d18;
  undefined1 local_cf0 [8];
  ProgramSources sources;
  MessageBuilder local_aa0;
  MessageBuilder local_920;
  MessageBuilder local_7a0;
  MessageBuilder local_620;
  MessageBuilder local_4a0;
  MessageBuilder local_320;
  MessageBuilder local_190;
  PointSizeCase *local_10;
  PointSizeCase *this_local;
  
  local_10 = this;
  checkExtensions(this);
  checkPointSizeRequirements(this);
  if ((this->m_flags & 1U) != 0) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_190,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_190,(char (*) [44])"Setting point size in vertex shader to 2.0.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_190);
  }
  if ((this->m_flags & 2U) != 0) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_320,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_320,
                        (char (*) [91])
                        "Setting point size in tessellation control shader to 4.0. (And ignoring it in evaluation)."
                       );
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_320);
  }
  if ((this->m_flags & 4U) != 0) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_4a0,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_4a0,
                        (char (*) [61])
                        "Setting point size in tessellation evaluation shader to 4.0.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4a0);
  }
  if ((this->m_flags & 8U) != 0) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_620,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_620,
                        (char (*) [86])
                        "Reading point size in tessellation control shader and adding 2.0 to it in evaluation."
                       );
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_620);
  }
  if ((this->m_flags & 0x10U) != 0) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_7a0,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_7a0,
                        (char (*) [96])
                        "Not setting point size in tessellation evaluation shader (resulting in the default point size)."
                       );
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_7a0);
  }
  if ((this->m_flags & 0x20U) != 0) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_920,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_920,(char (*) [46])"Setting point size in geometry shader to 6.0.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_920);
  }
  if ((this->m_flags & 0x40U) != 0) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_aa0,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_aa0,
                        (char (*) [54])"Reading point size in geometry shader and adding 2.0.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_aa0);
  }
  if ((this->m_flags & 0x80U) != 0) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&sources.separable,pTVar2,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&sources.separable,
                        (char (*) [81])
                        "Not setting point size in geometry shader (resulting in the default point size)."
                       );
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&sources.separable);
  }
  glu::ProgramSources::ProgramSources((ProgramSources *)local_cf0);
  (anonymous_namespace)::PointSizeCase::genVertexSource_abi_cxx11_(&local_d38,(PointSizeCase *)this)
  ;
  glu::VertexSource::VertexSource((VertexSource *)&local_d18,&local_d38);
  pPVar4 = glu::ProgramSources::operator<<((ProgramSources *)local_cf0,&local_d18);
  (anonymous_namespace)::PointSizeCase::genFragmentSource_abi_cxx11_
            (&local_d80,(PointSizeCase *)this);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_d60,&local_d80);
  glu::ProgramSources::operator<<(pPVar4,&local_d60);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_d60);
  std::__cxx11::string::~string((string *)&local_d80);
  glu::VertexSource::~VertexSource((VertexSource *)&local_d18);
  std::__cxx11::string::~string((string *)&local_d38);
  if ((this->m_flags & 0x1eU) != 0) {
    (anonymous_namespace)::PointSizeCase::genTessellationControlSource_abi_cxx11_
              (&local_dc8,(PointSizeCase *)this);
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)&local_da8,&local_dc8);
    pPVar4 = glu::ProgramSources::operator<<((ProgramSources *)local_cf0,&local_da8);
    (anonymous_namespace)::PointSizeCase::genTessellationEvaluationSource_abi_cxx11_
              (&local_e10,(PointSizeCase *)this);
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_df0,&local_e10);
    glu::ProgramSources::operator<<(pPVar4,&local_df0);
    glu::TessellationEvaluationSource::~TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_df0);
    std::__cxx11::string::~string((string *)&local_e10);
    glu::TessellationControlSource::~TessellationControlSource
              ((TessellationControlSource *)&local_da8);
    std::__cxx11::string::~string((string *)&local_dc8);
  }
  if ((this->m_flags & 0xe0U) != 0) {
    (anonymous_namespace)::PointSizeCase::genGeometrySource_abi_cxx11_
              (&local_e58,(PointSizeCase *)this);
    glu::GeometrySource::GeometrySource((GeometrySource *)&local_e38,&local_e58);
    glu::ProgramSources::operator<<((ProgramSources *)local_cf0,&local_e38);
    glu::GeometrySource::~GeometrySource((GeometrySource *)&local_e38);
    std::__cxx11::string::~string((string *)&local_e58);
  }
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = Context::getRenderContext((this->super_TestCase).m_context);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)local_cf0);
  this->m_program = this_00;
  pTVar2 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar2,this->m_program);
  bVar1 = glu::ShaderProgram::isOk(this->m_program);
  if (!bVar1) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e78,"failed to build program",&local_e79);
    tcu::TestError::TestError(this_01,&local_e78);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_cf0);
  return extraout_EAX;
}

Assistant:

void PointSizeCase::init (void)
{
	checkExtensions();
	checkPointSizeRequirements();

	// log

	if (m_flags & FLAG_VERTEX_SET)
		m_testCtx.getLog() << tcu::TestLog::Message << "Setting point size in vertex shader to 2.0." << tcu::TestLog::EndMessage;
	if (m_flags & FLAG_TESSELLATION_CONTROL_SET)
		m_testCtx.getLog() << tcu::TestLog::Message << "Setting point size in tessellation control shader to 4.0. (And ignoring it in evaluation)." << tcu::TestLog::EndMessage;
	if (m_flags & FLAG_TESSELLATION_EVALUATION_SET)
		m_testCtx.getLog() << tcu::TestLog::Message << "Setting point size in tessellation evaluation shader to 4.0." << tcu::TestLog::EndMessage;
	if (m_flags & FLAG_TESSELLATION_ADD)
		m_testCtx.getLog() << tcu::TestLog::Message << "Reading point size in tessellation control shader and adding 2.0 to it in evaluation." << tcu::TestLog::EndMessage;
	if (m_flags & FLAG_TESSELLATION_DONT_SET)
		m_testCtx.getLog() << tcu::TestLog::Message << "Not setting point size in tessellation evaluation shader (resulting in the default point size)." << tcu::TestLog::EndMessage;
	if (m_flags & FLAG_GEOMETRY_SET)
		m_testCtx.getLog() << tcu::TestLog::Message << "Setting point size in geometry shader to 6.0." << tcu::TestLog::EndMessage;
	if (m_flags & FLAG_GEOMETRY_ADD)
		m_testCtx.getLog() << tcu::TestLog::Message << "Reading point size in geometry shader and adding 2.0." << tcu::TestLog::EndMessage;
	if (m_flags & FLAG_GEOMETRY_DONT_SET)
		m_testCtx.getLog() << tcu::TestLog::Message << "Not setting point size in geometry shader (resulting in the default point size)." << tcu::TestLog::EndMessage;

	// program

	{
		glu::ProgramSources sources;
		sources	<< glu::VertexSource(genVertexSource())
				<< glu::FragmentSource(genFragmentSource());

		if (m_flags & (FLAG_TESSELLATION_CONTROL_SET | FLAG_TESSELLATION_EVALUATION_SET | FLAG_TESSELLATION_ADD | FLAG_TESSELLATION_DONT_SET))
			sources << glu::TessellationControlSource(genTessellationControlSource())
					<< glu::TessellationEvaluationSource(genTessellationEvaluationSource());

		if (m_flags & (FLAG_GEOMETRY_SET | FLAG_GEOMETRY_ADD | FLAG_GEOMETRY_DONT_SET))
			sources << glu::GeometrySource(genGeometrySource());

		m_program = new glu::ShaderProgram(m_context.getRenderContext(), sources);

		m_testCtx.getLog() << *m_program;
		if (!m_program->isOk())
			throw tcu::TestError("failed to build program");
	}
}